

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGather2DCase::verify
          (TextureGather2DCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  float (*pafVar1) [2];
  bool bVar2;
  undefined7 extraout_var;
  Vec2 texCoords [4];
  Texture2DView local_60;
  long local_50;
  Vector<float,_2> local_48;
  float afStack_40 [2];
  float local_38 [2];
  float afStack_30 [2];
  
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  afStack_30[0] = 0.0;
  afStack_30[1] = 0.0;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  afStack_40[0] = 0.0;
  afStack_40[1] = 0.0;
  (*(this->super_TextureGatherCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[9])
            (&local_60,this,(ulong)ctx & 0xffffffff);
  pafVar1 = (float (*) [2])CONCAT44(local_60._4_4_,local_60.m_numLevels);
  local_48.m_data = *pafVar1;
  afStack_40 = pafVar1[1];
  local_38 = pafVar1[2];
  afStack_30 = pafVar1[3];
  operator_delete(pafVar1,local_50 - (long)pafVar1);
  local_60.m_levels =
       (this->m_swizzledTexture).m_view.m_levels + (this->super_TextureGatherCase).m_baseLevel;
  local_60.m_numLevels = 1;
  bVar2 = (anonymous_namespace)::TextureGatherCase::verify<tcu::Texture2DView,tcu::Vector<float,2>>
                    ((TextureGatherCase *)this,(ConstPixelBufferAccess *)sig,&local_60,
                     (Vector<float,_2> (*) [4])&local_48,
                     (this->m_iterations).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                     ._M_impl.super__Vector_impl_data._M_start + (int)ctx);
  return (int)CONCAT71(extraout_var,bVar2);
}

Assistant:

bool TextureGather2DCase::verify (int iterationNdx, const ConstPixelBufferAccess& rendered) const
{
	Vec2 texCoords[4];
	computeTexCoordVecs(computeQuadTexCoord(iterationNdx), texCoords);
	return TextureGatherCase::verify(rendered, getOneLevelSubView(tcu::Texture2DView(m_swizzledTexture), m_baseLevel), texCoords, m_iterations[iterationNdx]);
}